

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlab6-3.c
# Opt level: O2

int CheckFromArray(void)

{
  _Bool _Var1;
  FILE *__stream;
  uint uVar2;
  char *__s;
  
  __stream = fopen("out.txt","r");
  if (__stream == (FILE *)0x0) {
    uVar2 = 0xffffffff;
    __s = "can\'t open out.txt";
  }
  else {
    _Var1 = Check(testInOut[testN].out1,testInOut[testN].out2,(FILE *)__stream);
    fclose(__stream);
    __s = "FAILED";
    if (_Var1) {
      __s = "PASSED";
    }
    uVar2 = (uint)!_Var1;
  }
  puts(__s);
  testN = testN + 1;
  return uVar2;
}

Assistant:

static int CheckFromArray(void) {
    FILE *const out = fopen("out.txt", "r");
    if (!out) {
        printf("can't open out.txt\n");
        testN++;
        return -1;
    }
    bool passed = Check(testInOut[testN].out1, testInOut[testN].out2, out);
    fclose(out);
    if (passed) {
        printf("PASSED\n");
        testN++;
        return 0;
    } else {
        printf("FAILED\n");
        testN++;
        return 1;
    }
}